

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

DnsNameEntry * __thiscall DnsNameEntry::CreateCopy(DnsNameEntry *this)

{
  size_t __n;
  size_t __n_00;
  uint8_t *__src;
  uint64_t uVar1;
  int iVar2;
  DnsStatsLeakType DVar3;
  int iVar4;
  int iVar5;
  DnsNameEntry *pDVar6;
  uint8_t *__dest;
  
  pDVar6 = (DnsNameEntry *)operator_new(0x50);
  pDVar6->HashNext = (DnsNameEntry *)0x0;
  pDVar6->hash = 0;
  pDVar6->rr_type = 0;
  pDVar6->flags = 0;
  pDVar6->name = (uint8_t *)0x0;
  pDVar6->count = 0;
  pDVar6->is_nx = 0;
  pDVar6->leakType = dnsLeakNoLeak;
  pDVar6->addr_len = 0;
  __n = this->name_len;
  pDVar6->name_len = __n;
  if (__n != 0) {
    __n_00 = this->addr_len;
    __src = this->name;
    uVar1 = this->count;
    __dest = (uint8_t *)operator_new__(__n + 1);
    pDVar6->name = __dest;
    iVar2 = this->is_nx;
    DVar3 = this->leakType;
    iVar4 = this->rr_type;
    iVar5 = this->flags;
    memcpy(__dest,__src,__n);
    __dest[__n] = '\0';
    pDVar6->count = uVar1;
    pDVar6->is_nx = iVar2;
    pDVar6->leakType = DVar3;
    memcpy(pDVar6->addr,this->addr,__n_00);
    pDVar6->addr_len = __n_00;
    pDVar6->rr_type = iVar4;
    pDVar6->flags = iVar5;
  }
  return pDVar6;
}

Assistant:

DnsNameEntry* DnsNameEntry::CreateCopy()
{
    DnsNameEntry* key = new DnsNameEntry();

    if (key != NULL)
    {
        key->name_len = name_len;
        if (name_len > 0) {
            if (key->name != NULL) {
                delete[] key->name;
            }

            key->name = new uint8_t[(size_t)name_len + 1];

            if (key->name == NULL) {
                delete key;
                key = NULL;
            }
            else {
                memcpy(key->name, name, name_len);
                key->name[name_len] = 0;
                key->count = count;
                key->is_nx = is_nx;
                key->leakType = leakType;
                memcpy(key->addr, addr, addr_len);
                key->addr_len = addr_len;
                key->rr_type = rr_type;
                key->flags = flags;
            }
        }
    }

    return key;
}